

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

bool __thiscall Game::hasCard(Game *this,size_t playerID,Card card)

{
  bool bVar1;
  reference __x;
  value_type playerHand;
  _Vector_base<Card,_std::allocator<Card>_> local_40;
  _Vector_base<Card,_std::allocator<Card>_> local_28;
  
  __x = std::
        vector<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
        ::at(&this->m_playerCards,playerID);
  std::vector<Card,_std::allocator<Card>_>::vector
            ((vector<Card,_std::allocator<Card>_> *)&local_28,__x);
  std::vector<Card,_std::allocator<Card>_>::vector
            ((vector<Card,_std::allocator<Card>_> *)&local_40,
             (vector<Card,_std::allocator<Card>_> *)&local_28);
  bVar1 = contains<Card>((vector<Card,_std::allocator<Card>_> *)&local_40,card);
  std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&local_40);
  std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&local_28);
  return bVar1;
}

Assistant:

bool Game::hasCard(size_t playerID, Card card){
   auto playerHand = m_playerCards.at(playerID);
   return contains(playerHand, card);
}